

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseModportSubroutinePortList(Parser *this,AttrList attributes)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token importExport_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ModportSubroutinePortSyntax *node;
  ModportNamedPortSyntax *node_00;
  undefined4 extraout_var;
  ModportSubroutinePortListSyntax *pMVar4;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Token TVar5;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> local_268;
  char local_238 [8];
  Info *pIStack_230;
  pointer local_228;
  size_type sStack_220;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_210;
  Token local_1e0;
  TokenOrSyntax local_1d0;
  Token local_1b8;
  Token local_1a8;
  Token local_198;
  Token local_188;
  TokenOrSyntax local_170;
  undefined1 auStack_158 [8];
  Token name;
  bitmask<slang::parsing::detail::FunctionOptions> local_12c;
  bitmask<slang::parsing::detail::FunctionOptions> local_128;
  underlying_type local_124;
  FunctionPrototypeSyntax *local_120;
  FunctionPrototypeSyntax *proto;
  undefined1 local_108 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token importExport;
  Parser *this_local;
  AttrList attributes_local;
  
  join_0x00000010_0x00000000_ = ParserBase::consume(&this->super_ParserBase);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)local_108);
  do {
    bVar1 = ParserBase::peek(&this->super_ParserBase,FunctionKeyword);
    if (bVar1) {
LAB_0057e14a:
      local_128 = parsing::detail::operator|(AllowEmptyArgNames,AllowTasks);
      bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_12c,IsPrototype);
      local_124 = (underlying_type)
                  bitmask<slang::parsing::detail::FunctionOptions>::operator|(&local_128,&local_12c)
      ;
      local_120 = parseFunctionPrototype
                            (this,Unknown,
                             (bitmask<slang::parsing::detail::FunctionOptions>)local_124,(bool *)0x0
                            );
      node = slang::syntax::SyntaxFactory::modportSubroutinePort(&this->factory,local_120);
      slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)&name.info,(SyntaxNode *)node);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                 (TokenOrSyntax *)&name.info);
    }
    else {
      bVar1 = ParserBase::peek(&this->super_ParserBase,TaskKeyword);
      if (bVar1) goto LAB_0057e14a;
      TVar5 = ParserBase::expect(&this->super_ParserBase,Identifier);
      name._0_8_ = TVar5.info;
      auStack_158 = TVar5._0_8_;
      local_188 = TVar5;
      node_00 = slang::syntax::SyntaxFactory::modportNamedPort(&this->factory,TVar5);
      slang::syntax::TokenOrSyntax::TokenOrSyntax(&local_170,(SyntaxNode *)node_00);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,&local_170);
      bVar1 = Token::isMissing((Token *)auStack_158);
      if (bVar1) {
LAB_0057e4a3:
        local_228 = attributes.data_;
        sStack_220 = attributes.size_;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  (&local_210,attributes);
        TVar5 = stack0xffffffffffffffd0;
        local_238[0] = buffer.stackBase[0xa0];
        local_238[1] = buffer.stackBase[0xa1];
        local_238[2] = buffer.stackBase[0xa2];
        local_238[3] = buffer.stackBase[0xa3];
        local_238[4] = buffer.stackBase[0xa4];
        local_238[5] = buffer.stackBase[0xa5];
        local_238[6] = buffer.stackBase[0xa6];
        local_238[7] = buffer.stackBase[0xa7];
        pIStack_230 = (Info *)importExport._0_8_;
        unique0x1000093e = TVar5;
        iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
        elements.data_._4_4_ = extraout_var;
        elements.data_._0_4_ = iVar3;
        elements.size_ = extraout_RDX;
        slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::SeparatedSyntaxList
                  (&local_268,elements);
        importExport_00.info = pIStack_230;
        importExport_00._0_8_ = local_238;
        pMVar4 = slang::syntax::SyntaxFactory::modportSubroutinePortList
                           (&this->factory,&local_210,importExport_00,&local_268);
        SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
                  ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)local_108);
        return &pMVar4->super_MemberSyntax;
      }
    }
    bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
    bVar1 = true;
    if (bVar2) {
      TVar5 = ParserBase::peek(&this->super_ParserBase,1);
      local_198.kind = TVar5.kind;
      bVar2 = local_198.kind != FunctionKeyword;
      bVar1 = false;
      local_198 = TVar5;
      if (bVar2) {
        TVar5 = ParserBase::peek(&this->super_ParserBase,1);
        local_1a8.kind = TVar5.kind;
        bVar2 = local_1a8.kind != TaskKeyword;
        bVar1 = false;
        local_1a8 = TVar5;
        if (bVar2) {
          TVar5 = ParserBase::peek(&this->super_ParserBase,1);
          local_1b8.kind = TVar5.kind;
          bVar1 = local_1b8.kind != Identifier;
          local_1b8 = TVar5;
        }
      }
    }
    if (bVar1) goto LAB_0057e4a3;
    TVar5 = ParserBase::consume(&this->super_ParserBase);
    local_1e0 = TVar5;
    slang::syntax::TokenOrSyntax::TokenOrSyntax(&local_1d0,TVar5);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,&local_1d0);
  } while( true );
}

Assistant:

MemberSyntax& Parser::parseModportSubroutinePortList(AttrList attributes) {
    auto importExport = consume();

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        if (peek(TokenKind::FunctionKeyword) || peek(TokenKind::TaskKeyword)) {
            auto& proto = parseFunctionPrototype(SyntaxKind::Unknown,
                                                 FunctionOptions::AllowEmptyArgNames |
                                                     FunctionOptions::AllowTasks |
                                                     FunctionOptions::IsPrototype);
            buffer.push_back(&factory.modportSubroutinePort(proto));
        }
        else {
            auto name = expect(TokenKind::Identifier);
            buffer.push_back(&factory.modportNamedPort(name));
            if (name.isMissing())
                break;
        }

        if (!peek(TokenKind::Comma) ||
            (peek(1).kind != TokenKind::FunctionKeyword && peek(1).kind != TokenKind::TaskKeyword &&
             peek(1).kind != TokenKind::Identifier)) {
            break;
        }

        buffer.push_back(consume());
    }

    return factory.modportSubroutinePortList(attributes, importExport, buffer.copy(alloc));
}